

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

int32_t __thiscall icu_63::LocalizationInfo::indexForRuleSet(LocalizationInfo *this,UChar *ruleset)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  uint uVar3;
  
  if (ruleset != (UChar *)0x0) {
    for (uVar3 = 0; iVar2 = (*this->_vptr_LocalizationInfo[3])(this), (int)uVar3 < iVar2;
        uVar3 = uVar3 + 1) {
      iVar2 = (*this->_vptr_LocalizationInfo[4])(this,(ulong)uVar3);
      UVar1 = streq(ruleset,(UChar *)CONCAT44(extraout_var,iVar2));
      if (UVar1 != '\0') {
        return uVar3;
      }
    }
  }
  return -1;
}

Assistant:

int32_t
LocalizationInfo::indexForRuleSet(const UChar* ruleset) const {
    if (ruleset) {
        for (int i = 0; i < getNumberOfRuleSets(); ++i) {
            if (streq(ruleset, getRuleSetName(i))) {
                return i;
            }
        }
    }
    return -1;
}